

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  InstancePrimitive *prim;
  bool bVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar38;
  float fVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  float fVar40;
  undefined1 auVar37 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  InstancePrimitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar3 = ray->tfar;
    auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      local_1300 = local_11d8 + 1;
      auVar23 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx((undefined1  [16])aVar5,auVar35);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar35,auVar41,1);
      auVar35 = vblendvps_avx((undefined1  [16])aVar5,auVar41,auVar35);
      auVar41 = vrcpps_avx(auVar35);
      fVar34 = auVar41._0_4_;
      auVar29._0_4_ = fVar34 * auVar35._0_4_;
      fVar38 = auVar41._4_4_;
      auVar29._4_4_ = fVar38 * auVar35._4_4_;
      fVar39 = auVar41._8_4_;
      auVar29._8_4_ = fVar39 * auVar35._8_4_;
      fVar40 = auVar41._12_4_;
      auVar29._12_4_ = fVar40 * auVar35._12_4_;
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar42,auVar29);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_1258._4_4_ = uVar4;
      local_1258._0_4_ = uVar4;
      local_1258._8_4_ = uVar4;
      local_1258._12_4_ = uVar4;
      local_1258._16_4_ = uVar4;
      local_1258._20_4_ = uVar4;
      local_1258._24_4_ = uVar4;
      local_1258._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1278._4_4_ = uVar4;
      local_1278._0_4_ = uVar4;
      local_1278._8_4_ = uVar4;
      local_1278._12_4_ = uVar4;
      local_1278._16_4_ = uVar4;
      local_1278._20_4_ = uVar4;
      local_1278._24_4_ = uVar4;
      local_1278._28_4_ = uVar4;
      auVar30._0_4_ = fVar34 + fVar34 * auVar35._0_4_;
      auVar30._4_4_ = fVar38 + fVar38 * auVar35._4_4_;
      auVar30._8_4_ = fVar39 + fVar39 * auVar35._8_4_;
      auVar30._12_4_ = fVar40 + fVar40 * auVar35._12_4_;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1298._4_4_ = uVar4;
      local_1298._0_4_ = uVar4;
      local_1298._8_4_ = uVar4;
      local_1298._12_4_ = uVar4;
      local_1298._16_4_ = uVar4;
      local_1298._20_4_ = uVar4;
      local_1298._24_4_ = uVar4;
      local_1298._28_4_ = uVar4;
      auVar35 = vshufps_avx(auVar30,auVar30,0);
      local_12b8._16_16_ = auVar35;
      local_12b8._0_16_ = auVar35;
      auVar35 = vmovshdup_avx(auVar30);
      auVar37 = ZEXT1664(auVar35);
      auVar41 = vshufps_avx(auVar30,auVar30,0x55);
      local_12d8._16_16_ = auVar41;
      local_12d8._0_16_ = auVar41;
      auVar41 = vshufpd_avx(auVar30,auVar30,1);
      auVar29 = vshufps_avx(auVar30,auVar30,0xaa);
      auVar33 = ZEXT1664(auVar29);
      uVar20 = (ulong)(auVar30._0_4_ < 0.0) * 0x20;
      uVar21 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x40;
      auVar43 = ZEXT3264(local_1258);
      auVar44 = ZEXT3264(local_1278);
      auVar45 = ZEXT3264(local_1298);
      auVar46 = ZEXT3264(local_12b8);
      auVar47 = ZEXT3264(local_12d8);
      local_11f8._16_16_ = auVar29;
      local_11f8._0_16_ = auVar29;
      auVar48 = ZEXT3264(local_11f8);
      uVar19 = (ulong)(auVar41._0_4_ < 0.0) << 5 | 0x80;
      auVar35 = vshufps_avx(auVar23,auVar23,0);
      auVar25 = ZEXT1664(auVar35);
      local_1218._16_16_ = auVar35;
      local_1218._0_16_ = auVar35;
      auVar49 = ZEXT3264(local_1218);
      auVar35 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_1238._16_16_ = auVar35;
      local_1238._0_16_ = auVar35;
      auVar50 = ZEXT3264(local_1238);
      local_12f8 = ray;
      local_12f0 = context;
LAB_00e7c834:
      if (local_1300 != local_11d8) {
        uVar16 = local_1300[-1];
        local_1300 = local_1300 + -1;
LAB_00e7c852:
        fVar3 = (ray->dir).field_0.m128[3];
        auVar22._4_4_ = fVar3;
        auVar22._0_4_ = fVar3;
        auVar22._8_4_ = fVar3;
        auVar22._12_4_ = fVar3;
        auVar22._16_4_ = fVar3;
        auVar22._20_4_ = fVar3;
        auVar22._24_4_ = fVar3;
        auVar22._28_4_ = fVar3;
        while ((uVar16 & 8) == 0) {
          uVar15 = uVar16 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar15 + 0x100 + uVar20);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar20);
          auVar24._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar24._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar24._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar24._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar24._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar24._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar24._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar24._28_4_ = auVar25._28_4_ + pfVar1[7];
          auVar24 = vsubps_avx(auVar24,auVar43._0_32_);
          auVar8._4_4_ = auVar46._4_4_ * auVar24._4_4_;
          auVar8._0_4_ = auVar46._0_4_ * auVar24._0_4_;
          auVar8._8_4_ = auVar46._8_4_ * auVar24._8_4_;
          auVar8._12_4_ = auVar46._12_4_ * auVar24._12_4_;
          auVar8._16_4_ = auVar46._16_4_ * auVar24._16_4_;
          auVar8._20_4_ = auVar46._20_4_ * auVar24._20_4_;
          auVar8._24_4_ = auVar46._24_4_ * auVar24._24_4_;
          auVar8._28_4_ = auVar24._28_4_;
          auVar24 = vmaxps_avx(auVar49._0_32_,auVar8);
          pfVar2 = (float *)(uVar15 + 0x100 + uVar21);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar21);
          auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar26._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar26._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar26._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar26._28_4_ = auVar28._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar26,auVar44._0_32_);
          auVar7._4_4_ = auVar47._4_4_ * auVar8._4_4_;
          auVar7._0_4_ = auVar47._0_4_ * auVar8._0_4_;
          auVar7._8_4_ = auVar47._8_4_ * auVar8._8_4_;
          auVar7._12_4_ = auVar47._12_4_ * auVar8._12_4_;
          auVar7._16_4_ = auVar47._16_4_ * auVar8._16_4_;
          auVar7._20_4_ = auVar47._20_4_ * auVar8._20_4_;
          auVar7._24_4_ = auVar47._24_4_ * auVar8._24_4_;
          auVar7._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar15 + 0x100 + uVar19);
          pfVar1 = (float *)(uVar15 + 0x40 + uVar19);
          auVar31._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar31._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar31._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar31._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar31._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar31._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar31._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar31._28_4_ = auVar33._28_4_ + pfVar1[7];
          auVar9 = vsubps_avx(auVar31,auVar45._0_32_);
          auVar11._4_4_ = auVar48._4_4_ * auVar9._4_4_;
          auVar11._0_4_ = auVar48._0_4_ * auVar9._0_4_;
          auVar11._8_4_ = auVar48._8_4_ * auVar9._8_4_;
          auVar11._12_4_ = auVar48._12_4_ * auVar9._12_4_;
          auVar11._16_4_ = auVar48._16_4_ * auVar9._16_4_;
          auVar11._20_4_ = auVar48._20_4_ * auVar9._20_4_;
          auVar11._24_4_ = auVar48._24_4_ * auVar9._24_4_;
          auVar11._28_4_ = auVar9._28_4_;
          auVar8 = vmaxps_avx(auVar7,auVar11);
          auVar24 = vmaxps_avx(auVar24,auVar8);
          pfVar2 = (float *)(uVar15 + 0x100 + (uVar20 ^ 0x20));
          pfVar1 = (float *)(uVar15 + 0x40 + (uVar20 ^ 0x20));
          auVar27._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar27._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar27._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar27._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar27._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar27._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar27._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar27._28_4_ = auVar8._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar27,auVar43._0_32_);
          auVar12._4_4_ = auVar46._4_4_ * auVar8._4_4_;
          auVar12._0_4_ = auVar46._0_4_ * auVar8._0_4_;
          auVar12._8_4_ = auVar46._8_4_ * auVar8._8_4_;
          auVar12._12_4_ = auVar46._12_4_ * auVar8._12_4_;
          auVar12._16_4_ = auVar46._16_4_ * auVar8._16_4_;
          auVar12._20_4_ = auVar46._20_4_ * auVar8._20_4_;
          auVar12._24_4_ = auVar46._24_4_ * auVar8._24_4_;
          auVar12._28_4_ = auVar8._28_4_;
          pfVar2 = (float *)(uVar15 + 0x100 + (uVar21 ^ 0x20));
          auVar7 = vminps_avx(auVar50._0_32_,auVar12);
          pfVar1 = (float *)(uVar15 + 0x40 + (uVar21 ^ 0x20));
          auVar32._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar32._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar32._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar32._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar32._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar32._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar32._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar32._28_4_ = auVar9._28_4_ + pfVar1[7];
          auVar8 = vsubps_avx(auVar32,auVar44._0_32_);
          pfVar2 = (float *)(uVar15 + 0x100 + (uVar19 ^ 0x20));
          pfVar1 = (float *)(uVar15 + 0x40 + (uVar19 ^ 0x20));
          auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar36._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar36._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar36._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar36._28_4_ = auVar37._28_4_ + pfVar1[7];
          auVar9._4_4_ = auVar47._4_4_ * auVar8._4_4_;
          auVar9._0_4_ = auVar47._0_4_ * auVar8._0_4_;
          auVar9._8_4_ = auVar47._8_4_ * auVar8._8_4_;
          auVar9._12_4_ = auVar47._12_4_ * auVar8._12_4_;
          auVar9._16_4_ = auVar47._16_4_ * auVar8._16_4_;
          auVar9._20_4_ = auVar47._20_4_ * auVar8._20_4_;
          auVar9._24_4_ = auVar47._24_4_ * auVar8._24_4_;
          auVar9._28_4_ = auVar8._28_4_;
          auVar8 = vsubps_avx(auVar36,auVar45._0_32_);
          auVar13._4_4_ = auVar48._4_4_ * auVar8._4_4_;
          auVar13._0_4_ = auVar48._0_4_ * auVar8._0_4_;
          auVar13._8_4_ = auVar48._8_4_ * auVar8._8_4_;
          auVar13._12_4_ = auVar48._12_4_ * auVar8._12_4_;
          auVar13._16_4_ = auVar48._16_4_ * auVar8._16_4_;
          auVar13._20_4_ = auVar48._20_4_ * auVar8._20_4_;
          auVar13._24_4_ = auVar48._24_4_ * auVar8._24_4_;
          auVar13._28_4_ = auVar8._28_4_;
          auVar37 = ZEXT3264(auVar13);
          auVar8 = vminps_avx(auVar9,auVar13);
          auVar7 = vminps_avx(auVar7,auVar8);
          auVar24 = vcmpps_avx(auVar24,auVar7,2);
          if (((uint)uVar16 & 7) == 6) {
            auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar22,2);
            auVar8 = vcmpps_avx(auVar22,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
            auVar7 = vandps_avx(auVar7,auVar8);
            auVar24 = vandps_avx(auVar7,auVar24);
          }
          auVar33 = ZEXT3264(auVar8);
          auVar35 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
          auVar23 = vpsllw_avx(auVar35,0xf);
          auVar25 = ZEXT1664(auVar23);
          auVar35 = vpacksswb_avx(auVar23,auVar23);
          auVar28 = ZEXT1664(auVar35);
          bVar10 = SUB161(auVar35 >> 7,0) & 1 | (SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar35 >> 0x17,0) & 1) << 2 | (SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar35 >> 0x27,0) & 1) << 4 | (SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar35 >> 0x37,0) & 1) << 6 | SUB161(auVar35 >> 0x3f,0) << 7;
          if ((((((((auVar23 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar23 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar23 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar23 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar23[0xf]) goto LAB_00e7c834;
          lVar6 = 0;
          if (bVar10 != 0) {
            for (; (bVar10 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar16 = *(ulong *)(uVar15 + lVar6 * 8);
          uVar17 = bVar10 - 1 & (uint)bVar10;
          uVar18 = (ulong)uVar17;
          if (uVar17 != 0) goto LAB_00e7c992;
        }
        local_12e8 = (InstancePrimitive *)(uVar16 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar16 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          auVar25 = ZEXT1664(auVar25._0_16_);
          auVar28 = ZEXT1664(auVar28._0_16_);
          auVar33 = ZEXT1664(auVar33._0_16_);
          auVar37 = ZEXT1664(auVar37._0_16_);
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar14 = InstanceIntersector1MB::occluded(&local_1301,ray,local_12f0,prim);
          auVar50 = ZEXT3264(local_1238);
          auVar49 = ZEXT3264(local_1218);
          auVar48 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar14) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar43 = ZEXT3264(local_1258);
        auVar44 = ZEXT3264(local_1278);
        auVar45 = ZEXT3264(local_1298);
        auVar46 = ZEXT3264(local_12b8);
        auVar47 = ZEXT3264(local_12d8);
        goto LAB_00e7c834;
      }
    }
  }
  return;
LAB_00e7c992:
  do {
    *local_1300 = uVar16;
    local_1300 = local_1300 + 1;
    lVar6 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    uVar16 = *(ulong *)(uVar15 + lVar6 * 8);
    uVar18 = uVar18 - 1 & uVar18;
  } while (uVar18 != 0);
  goto LAB_00e7c852;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }